

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clickrem.c
# Opt level: O3

void dumb_remove_clicks(DUMB_CLICK_REMOVER *cr,sample_t_conflict *samples,int32 length,int step,
                       double halflife)

{
  DUMB_CLICK *pDVar1;
  DUMB_CLICK *pDVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  DUMB_CLICK *pDVar11;
  long lVar12;
  int iVar13;
  double dVar14;
  
  if (cr != (DUMB_CLICK_REMOVER *)0x0) {
    dVar14 = exp2(-1.0 / halflife);
    dVar14 = floor(dVar14 * 2147483648.0);
    iVar13 = (int)dVar14;
    pDVar1 = dumb_click_mergesort(cr->click,cr->n_clicks);
    cr->click = (DUMB_CLICK *)0x0;
    cr->n_clicks = 0;
    if (pDVar1 == (DUMB_CLICK *)0x0) {
      uVar6 = (ulong)(uint)cr->offset;
      iVar7 = 0;
    }
    else {
      lVar10 = (long)step;
      uVar6 = (ulong)(uint)cr->offset;
      lVar8 = 0;
      pDVar11 = cr->free_clicks;
      do {
        pDVar2 = pDVar1;
        pDVar1 = pDVar2->next;
        lVar12 = pDVar2->pos * lVar10;
        iVar4 = (int)uVar6;
        iVar9 = (int)lVar12;
        iVar7 = (int)lVar8;
        if (iVar4 < 0) {
          uVar3 = -iVar4;
          uVar6 = (ulong)uVar3;
          if (iVar7 < iVar9) {
            lVar8 = (long)iVar7;
            do {
              samples[lVar8] = samples[lVar8] - (int)uVar6;
              uVar5 = (long)((int)uVar6 * 2) * (long)iVar13;
              uVar6 = uVar5 >> 0x20;
              uVar3 = (uint)(uVar5 >> 0x20);
              lVar8 = lVar8 + lVar10;
            } while (lVar8 < iVar9);
          }
          iVar4 = -uVar3;
        }
        else if (iVar7 < iVar9) {
          lVar8 = (long)iVar7;
          do {
            samples[lVar8] = samples[lVar8] + (int)uVar6;
            uVar5 = (long)((int)uVar6 * 2) * (long)iVar13;
            uVar6 = uVar5 >> 0x20;
            iVar4 = (int)(uVar5 >> 0x20);
            lVar8 = lVar8 + lVar10;
          } while (lVar8 < lVar12);
        }
        iVar7 = (int)lVar8;
        uVar3 = iVar4 - pDVar2->step;
        uVar6 = (ulong)uVar3;
        cr->offset = uVar3;
        pDVar2->next = pDVar11;
        pDVar11 = pDVar2;
      } while (pDVar1 != (DUMB_CLICK *)0x0);
      cr->free_clicks = pDVar2;
    }
    iVar9 = length * step;
    iVar4 = (int)uVar6;
    if (iVar4 < 0) {
      uVar3 = -iVar4;
      uVar6 = (ulong)uVar3;
      if (iVar7 < iVar9) {
        lVar8 = (long)iVar7;
        do {
          samples[lVar8] = samples[lVar8] - (int)uVar6;
          uVar5 = (long)((int)uVar6 * 2) * (long)iVar13;
          uVar6 = uVar5 >> 0x20;
          uVar3 = (uint)(uVar5 >> 0x20);
          lVar8 = lVar8 + step;
        } while (lVar8 < iVar9);
      }
      iVar4 = -uVar3;
    }
    else if (iVar7 < iVar9) {
      lVar8 = (long)iVar7;
      do {
        samples[lVar8] = samples[lVar8] + (int)uVar6;
        uVar5 = (long)((int)uVar6 * 2) * (long)iVar13;
        uVar6 = uVar5 >> 0x20;
        iVar4 = (int)(uVar5 >> 0x20);
        lVar8 = lVar8 + step;
      } while (lVar8 < iVar9);
    }
    cr->offset = iVar4;
  }
  return;
}

Assistant:

void DUMBEXPORT dumb_remove_clicks(DUMB_CLICK_REMOVER *cr, sample_t *samples, int32 length, int step, double halflife)
{
	DUMB_CLICK *click;
	int32 pos = 0;
	int offset;
	int factor;

	if (!cr) return;

	factor = (int)floor(pow(0.5, 1.0/halflife) * (1U << 31));

	click = dumb_click_mergesort(cr->click, cr->n_clicks);
	cr->click = NULL;
	cr->n_clicks = 0;

	length *= step;

	while (click) {
		DUMB_CLICK *next = click->next;
		int end = click->pos * step;
		ASSERT(end <= length);
		offset = cr->offset;
		if (offset < 0) {
			offset = -offset;
			while (pos < end) {
				samples[pos] -= offset;
				offset = (int)(((LONG_LONG)(offset << 1) * factor) >> 32);
				pos += step;
			}
			offset = -offset;
		} else {
			while (pos < end) {
				samples[pos] += offset;
				offset = (int)(((LONG_LONG)(offset << 1) * factor) >> 32);
				pos += step;
			}
		}
		cr->offset = offset - click->step;
		free_click(cr, click);
		click = next;
	}

	offset = cr->offset;
	if (offset < 0) {
		offset = -offset;
		while (pos < length) {
			samples[pos] -= offset;
			offset = (int)((LONG_LONG)(offset << 1) * factor >> 32);
			pos += step;
		}
		offset = -offset;
	} else {
		while (pos < length) {
			samples[pos] += offset;
			offset = (int)((LONG_LONG)(offset << 1) * factor >> 32);
			pos += step;
		}
	}
	cr->offset = offset;
}